

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O2

void duckdb::AggregateExecutor::
     UnaryFlatUpdateLoop<duckdb::ModeState<duckdb::uhugeint_t,duckdb::ModeStandard<duckdb::uhugeint_t>>,duckdb::uhugeint_t,duckdb::ModeFunction<duckdb::ModeStandard<duckdb::uhugeint_t>>>
               (uhugeint_t *idata,AggregateInputData *aggr_input_data,
               ModeState<duckdb::uhugeint_t,_duckdb::ModeStandard<duckdb::uhugeint_t>_> *state,
               idx_t count,ValidityMask *mask)

{
  unsigned_long *puVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  uhugeint_t *puVar6;
  ulong uVar7;
  ulong uVar8;
  
  uVar5 = 0;
  uVar7 = 0;
  do {
    if (uVar5 == count + 0x3f >> 6) {
      return;
    }
    puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
    if (puVar1 == (unsigned_long *)0x0) {
      uVar8 = uVar7 + 0x40;
      if (count <= uVar7 + 0x40) {
        uVar8 = count;
      }
LAB_00c0fc45:
      puVar6 = idata + uVar7;
      for (; uVar3 = uVar7, uVar7 < uVar8; uVar7 = uVar7 + 1) {
        BaseModeFunction<duckdb::ModeStandard<duckdb::uhugeint_t>>::
        Execute<duckdb::uhugeint_t,duckdb::ModeState<duckdb::uhugeint_t,duckdb::ModeStandard<duckdb::uhugeint_t>>,duckdb::ModeFunction<duckdb::ModeStandard<duckdb::uhugeint_t>>>
                  (state,puVar6,aggr_input_data);
        puVar6 = puVar6 + 1;
      }
    }
    else {
      uVar2 = puVar1[uVar5];
      uVar8 = uVar7 + 0x40;
      if (count <= uVar7 + 0x40) {
        uVar8 = count;
      }
      if (uVar2 == 0xffffffffffffffff) goto LAB_00c0fc45;
      uVar3 = uVar8;
      if (uVar2 != 0) {
        puVar6 = idata + uVar7;
        for (uVar4 = 0; uVar3 = uVar4 + uVar7, uVar4 + uVar7 < uVar8; uVar4 = uVar4 + 1) {
          if ((uVar2 >> (uVar4 & 0x3f) & 1) != 0) {
            BaseModeFunction<duckdb::ModeStandard<duckdb::uhugeint_t>>::
            Execute<duckdb::uhugeint_t,duckdb::ModeState<duckdb::uhugeint_t,duckdb::ModeStandard<duckdb::uhugeint_t>>,duckdb::ModeFunction<duckdb::ModeStandard<duckdb::uhugeint_t>>>
                      (state,puVar6,aggr_input_data);
          }
          puVar6 = puVar6 + 1;
        }
      }
    }
    uVar5 = uVar5 + 1;
    uVar7 = uVar3;
  } while( true );
}

Assistant:

static inline void UnaryFlatUpdateLoop(const INPUT_TYPE *__restrict idata, AggregateInputData &aggr_input_data,
	                                       STATE_TYPE *__restrict state, idx_t count, ValidityMask &mask) {
		AggregateUnaryInput input(aggr_input_data, mask);
		auto &base_idx = input.input_idx;
		base_idx = 0;
		auto entry_count = ValidityMask::EntryCount(count);
		for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
			auto validity_entry = mask.GetValidityEntry(entry_idx);
			idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
			if (!OP::IgnoreNull() || ValidityMask::AllValid(validity_entry)) {
				// all valid: perform operation
				for (; base_idx < next; base_idx++) {
					OP::template Operation<INPUT_TYPE, STATE_TYPE, OP>(*state, idata[base_idx], input);
				}
			} else if (ValidityMask::NoneValid(validity_entry)) {
				// nothing valid: skip all
				base_idx = next;
				continue;
			} else {
				// partially valid: need to check individual elements for validity
				idx_t start = base_idx;
				for (; base_idx < next; base_idx++) {
					if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
						OP::template Operation<INPUT_TYPE, STATE_TYPE, OP>(*state, idata[base_idx], input);
					}
				}
			}
		}
	}